

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O3

void Ivy_TruthDsdPrint_rec(FILE *pFile,int iNode,Vec_Int_t *vTree)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  
  if ((iNode < 0) || (vTree->nSize <= iNode)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar1 = vTree->pArray[(uint)iNode];
  switch(uVar1 & 0xf) {
  case 0:
    pcVar4 = "\'";
    if ((uVar1 & 0x10) == 0) {
      pcVar4 = "";
    }
    fprintf((FILE *)pFile,"%c%s",(ulong)(iNode + 0x61),pcVar4);
    return;
  case 1:
    pcVar4 = "\'";
    if ((uVar1 & 0x10) == 0) {
      pcVar4 = "";
    }
    pcVar8 = "Const1%s";
    break;
  case 2:
    Ivy_TruthDsdPrint_rec(pFile,uVar1 >> 9 & 7,vTree);
    pcVar4 = "\'";
    if ((uVar1 & 0x10) == 0) {
      pcVar4 = "";
    }
    fputs(pcVar4,(FILE *)pFile);
    return;
  case 3:
    fwrite("AND(",4,1,(FILE *)pFile);
    uVar2 = uVar1 >> 5 & 7;
    if (uVar2 != 0) {
      uVar6 = 0;
      do {
        Ivy_TruthDsdPrint_rec(pFile,(uVar1 >> 8 & 0xf) >> 1,vTree);
        pcVar4 = "\'";
        if ((uVar1 >> 8 & 1) == 0) {
          pcVar4 = "";
        }
        fputs(pcVar4,(FILE *)pFile);
        if (uVar6 - uVar2 != -1) {
          fputc(0x2c,(FILE *)pFile);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar2);
    }
    pcVar4 = "\'";
    if ((uVar1 & 0x10) == 0) {
      pcVar4 = "";
    }
    pcVar8 = ")%s";
    break;
  case 4:
    fwrite("EXOR(",5,1,(FILE *)pFile);
    uVar2 = uVar1 >> 5 & 7;
    if (uVar2 != 0) {
      iVar3 = -uVar2;
      iVar5 = 0;
      iVar7 = iVar3;
      uVar2 = uVar1 >> 8;
      do {
        Ivy_TruthDsdPrint_rec(pFile,(uVar2 & 0xf) >> 1,vTree);
        if (iVar7 != -1) {
          fputc(0x2c,(FILE *)pFile);
        }
        if ((uVar2 & 1) != 0) {
          __assert_fail("(Var & 1) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyDsd.c"
                        ,0x213,"void Ivy_TruthDsdPrint_rec(FILE *, int, Vec_Int_t *)");
        }
        iVar5 = iVar5 + 1;
        iVar7 = iVar3 + iVar5;
        uVar2 = uVar1 >> 0xc;
      } while (iVar7 != 0);
    }
    pcVar4 = "\'";
    if ((uVar1 & 0x10) == 0) {
      pcVar4 = "";
    }
    pcVar8 = ")%s";
    break;
  case 5:
  case 6:
    if ((uVar1 & 0x10) == 0) {
      pcVar4 = "MAJ(";
      if ((uVar1 & 0xf) == 5) {
        pcVar4 = "MUX(";
      }
      fputs(pcVar4,(FILE *)pFile);
      Ivy_TruthDsdPrint_rec(pFile,uVar1 >> 9 & 7,vTree);
      pcVar8 = "\'";
      pcVar4 = "\'";
      if ((uVar1 >> 8 & 1) == 0) {
        pcVar4 = "";
      }
      fputs(pcVar4,(FILE *)pFile);
      fputc(0x2c,(FILE *)pFile);
      Ivy_TruthDsdPrint_rec(pFile,uVar1 >> 0xd & 7,vTree);
      pcVar4 = "\'";
      if ((uVar1 >> 0xc & 1) == 0) {
        pcVar4 = "";
      }
      fputs(pcVar4,(FILE *)pFile);
      fputc(0x2c,(FILE *)pFile);
      Ivy_TruthDsdPrint_rec(pFile,uVar1 >> 0x11 & 7,vTree);
      if ((uVar1 >> 0x10 & 1) == 0) {
        pcVar8 = "";
      }
      fputs(pcVar8,(FILE *)pFile);
      fputc(0x29,(FILE *)pFile);
      return;
    }
    __assert_fail("Node.fCompl == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyDsd.c"
                  ,0x21a,"void Ivy_TruthDsdPrint_rec(FILE *, int, Vec_Int_t *)");
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyDsd.c"
                  ,0x229,"void Ivy_TruthDsdPrint_rec(FILE *, int, Vec_Int_t *)");
  }
  fprintf((FILE *)pFile,pcVar8,pcVar4);
  return;
}

Assistant:

void Ivy_TruthDsdPrint_rec( FILE * pFile, int iNode, Vec_Int_t * vTree )
{
    int Var, i;
    // get the node
    Ivy_Dec_t Node = Ivy_IntToDec( Vec_IntEntry(vTree, iNode) );
    // compute the node function
    if ( Node.Type == IVY_DEC_CONST1 )
        fprintf( pFile, "Const1%s", (Node.fCompl? "\'" : "") );
    else if ( Node.Type == IVY_DEC_PI )
        fprintf( pFile, "%c%s", 'a' + iNode, (Node.fCompl? "\'" : "") );
    else if ( Node.Type == IVY_DEC_BUF )
    {
        Ivy_TruthDsdPrint_rec( pFile, Node.Fan0 >> 1, vTree );
        fprintf( pFile, "%s", (Node.fCompl? "\'" : "") );
    }
    else if ( Node.Type == IVY_DEC_AND )
    {
        fprintf( pFile, "AND(" );
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            Ivy_TruthDsdPrint_rec( pFile, Var >> 1, vTree );
            fprintf( pFile, "%s", (Var & 1)? "\'" : "" );
            if ( i != (int)Node.nFans-1 )
                fprintf( pFile, "," );
        }
        fprintf( pFile, ")%s", (Node.fCompl? "\'" : "") );
    }
    else if ( Node.Type == IVY_DEC_EXOR )
    {
        fprintf( pFile, "EXOR(" );
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            Ivy_TruthDsdPrint_rec( pFile, Var >> 1, vTree );
            if ( i != (int)Node.nFans-1 )
                fprintf( pFile, "," );
            assert( (Var & 1) == 0 );
        }
        fprintf( pFile, ")%s", (Node.fCompl? "\'" : "") );
    }
    else if ( Node.Type == IVY_DEC_MUX || Node.Type == IVY_DEC_MAJ )
    {
        int VarC, Var1, Var0;
        assert( Node.fCompl == 0 );
        VarC = Ivy_DecGetVar( &Node, 0 );
        Var1 = Ivy_DecGetVar( &Node, 1 );
        Var0 = Ivy_DecGetVar( &Node, 2 );
        fprintf( pFile, "%s", (Node.Type == IVY_DEC_MUX)? "MUX(" : "MAJ(" );
        Ivy_TruthDsdPrint_rec( pFile, VarC >> 1, vTree );
        fprintf( pFile, "%s", (VarC & 1)? "\'" : "" );
        fprintf( pFile, "," );
        Ivy_TruthDsdPrint_rec( pFile, Var1 >> 1, vTree );
        fprintf( pFile, "%s", (Var1 & 1)? "\'" : "" );
        fprintf( pFile, "," );
        Ivy_TruthDsdPrint_rec( pFile, Var0 >> 1, vTree );
        fprintf( pFile, "%s", (Var0 & 1)? "\'" : "" );
        fprintf( pFile, ")" );
    }
    else assert( 0 );
}